

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

void pbrt::ParseString(SceneRepresentation *scene,string *str)

{
  undefined8 uVar1;
  unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> t;
  undefined1 local_68 [32];
  code *local_48;
  code *local_40;
  function<void_(const_char_*,_const_pbrt::FileLoc_*)> local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)str);
  local_68._16_8_ = 0;
  local_68._24_8_ = 0;
  local_40 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:889:21)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<void_(const_char_*,_const_pbrt::FileLoc_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/parser.cpp:889:21)>
             ::_M_manager;
  std::
  make_unique<pbrt::Tokenizer,std::__cxx11::string,std::function<void(char_const*,pbrt::FileLoc_const*)>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,&local_30
            );
  std::_Function_base::~_Function_base((_Function_base *)(local_68 + 0x10));
  std::__cxx11::string::~string((string *)&local_30);
  uVar1 = local_68._0_8_;
  if ((pointer)local_68._0_8_ != (pointer)0x0) {
    local_68._0_8_ = (pointer)0x0;
    local_68._8_8_ = uVar1;
    parse(scene,(unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)(local_68 + 8)
         );
    std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
              ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)(local_68 + 8))
    ;
  }
  std::unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_>::~unique_ptr
            ((unique_ptr<pbrt::Tokenizer,_std::default_delete<pbrt::Tokenizer>_> *)local_68);
  return;
}

Assistant:

void ParseString(SceneRepresentation *scene, std::string str) {
    auto tokError = [](const char *msg, const FileLoc *loc) {
        ErrorExit(loc, "%s", msg);
    };
    std::unique_ptr<Tokenizer> t = Tokenizer::CreateFromString(std::move(str), tokError);
    if (!t)
        return;
    parse(scene, std::move(t));
}